

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.cpp
# Opt level: O2

void cbPlayback(void *userdata,uint8_t *stream,int len)

{
  int keyPressed;
  
  keyPressed = -1;
  std::istream::read((char *)userdata,(long)&keyPressed);
  if ((*(byte *)((long)userdata + *(long *)(*userdata + -0x18) + 0x20) & 2) == 0) {
    putchar(keyPressed);
    fflush(_stdout);
    std::istream::read((char *)userdata,(long)stream);
    if ((*(byte *)((long)userdata + *(long *)(*userdata + -0x18) + 0x20) & 2) == 0) {
      return;
    }
  }
  g_terminate = true;
  return;
}

Assistant:

void cbPlayback(void * userdata, uint8_t * stream, int len) {
    std::ifstream * fin = (std::ifstream *)(userdata);
    int keyPressed = -1;
    fin->read((char *)(&keyPressed), sizeof(keyPressed));
    if (fin->eof()) {
        g_terminate = true;
        return;
    }
    printf("%c", keyPressed);
    fflush(stdout);
    fin->read((char *)(stream), len); // todo
    if (fin->eof()) g_terminate = true;
}